

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_safecopyLiterals(BYTE *op,BYTE *ip,BYTE *iend,BYTE *ilimit_w)

{
  BYTE *pBVar1;
  undefined8 uVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  long lVar5;
  
  if (iend <= ilimit_w) {
    __assert_fail("iend > ilimit_w",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4661,
                  "void ZSTD_safecopyLiterals(BYTE *, const BYTE *, const BYTE *const, const BYTE *)"
                 );
  }
  pBVar3 = ip;
  pBVar4 = op;
  if (ip <= ilimit_w) {
    if ((BYTE *)0xffffffffffffffe0 < op + (-0x10 - (long)ip)) {
      __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x36a6,
                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
    }
    pBVar4 = op + ((long)ilimit_w - (long)ip);
    uVar2 = *(undefined8 *)(ip + 8);
    *(undefined8 *)op = *(undefined8 *)ip;
    *(undefined8 *)(op + 8) = uVar2;
    pBVar3 = ilimit_w;
    if (0x10 < (long)ilimit_w - (long)ip) {
      lVar5 = 0x10;
      do {
        uVar2 = *(undefined8 *)(ip + lVar5 + 8);
        pBVar1 = op + lVar5;
        *(undefined8 *)pBVar1 = *(undefined8 *)(ip + lVar5);
        *(undefined8 *)(pBVar1 + 8) = uVar2;
        uVar2 = *(undefined8 *)(ip + lVar5 + 0x10 + 8);
        *(undefined8 *)(pBVar1 + 0x10) = *(undefined8 *)(ip + lVar5 + 0x10);
        *(undefined8 *)(pBVar1 + 0x18) = uVar2;
        lVar5 = lVar5 + 0x20;
      } while (pBVar1 + 0x20 < pBVar4);
    }
  }
  if (pBVar3 < iend) {
    lVar5 = 0;
    do {
      pBVar4[lVar5] = pBVar3[lVar5];
      lVar5 = lVar5 + 1;
    } while ((long)iend - (long)pBVar3 != lVar5);
  }
  return;
}

Assistant:

static void
ZSTD_safecopyLiterals(BYTE* op, BYTE const* ip, BYTE const* const iend, BYTE const* ilimit_w)
{
    assert(iend > ilimit_w);
    if (ip <= ilimit_w) {
        ZSTD_wildcopy(op, ip, ilimit_w - ip, ZSTD_no_overlap);
        op += ilimit_w - ip;
        ip = ilimit_w;
    }
    while (ip < iend) *op++ = *ip++;
}